

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void deseason_ma(double *sig,int N,int s,double *oup)

{
  double *oup_00;
  void *__ptr;
  void *__ptr_00;
  double wi;
  double temp;
  int it;
  int per;
  int count;
  int jd;
  int odd;
  int q;
  int window;
  int k;
  double *seas;
  double *w;
  double *mt;
  double *oup_local;
  int s_local;
  int N_local;
  double *sig_local;
  
  oup_00 = (double *)malloc((long)N << 3);
  __ptr = malloc((long)s << 3);
  __ptr_00 = malloc((long)s << 3);
  mafilter2(sig,N,s,oup_00);
  if (s % 2 == 0) {
    jd = s / 2;
  }
  else {
    jd = (s + -1) / 2;
  }
  for (q = 0; q < s; q = q + 1) {
    it = 0;
    wi = 0.0;
    for (per = q; per < N + jd * -2; per = s + per) {
      wi = (wi + sig[jd + per]) - oup_00[jd + per];
      it = it + 1;
    }
    *(double *)((long)__ptr + (long)((q + jd) - ((q + jd) / s) * s) * 8) = wi / (double)it;
  }
  wi = 0.0;
  for (q = 0; q < s; q = q + 1) {
    wi = *(double *)((long)__ptr + (long)q * 8) + wi;
  }
  for (q = 0; q < s; q = q + 1) {
    *(double *)((long)__ptr_00 + (long)q * 8) =
         *(double *)((long)__ptr + (long)q * 8) - wi / (double)s;
  }
  for (q = 0; q < N; q = q + 1) {
    for (temp._0_4_ = q; s <= temp._0_4_; temp._0_4_ = temp._0_4_ - s) {
    }
    oup[q] = sig[q] - *(double *)((long)__ptr_00 + (long)temp._0_4_ * 8);
  }
  free(__ptr);
  free(__ptr_00);
  free(oup_00);
  return;
}

Assistant:

void deseason_ma(double *sig,int N,int s,double *oup) {
	double *mt,*w,*seas;
	int k,window,q,odd,jd,count,per,it;
	double temp,wi;
	
	window = s;
	mt = (double*) malloc(sizeof(double) * N);	
	w = (double*) malloc(sizeof(double) * window);	
	seas = (double*) malloc(sizeof(double) * window);
	
	mafilter2(sig,N,window,mt);
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	for(k = 0; k < window;++k) {
		jd = k;
		count = 0;
		temp = 0.0;
		while (jd < N - 2*q) {
			temp = temp + sig[q+jd]-mt[q+jd];
			count++;
			jd+=window;
		}
		per = k + q -((k+q)/window)*window;
		w[per] = temp/count;
	}
	
	temp = 0.0;
	for(k = 0; k < window;++k)  {
		temp += w[k];
	}
	wi = temp/window;
	
	for(k = 0; k < window;++k)  {
		seas[k] = w[k] - wi;
	}
	
	for(k = 0; k < N;++k) {
		it = k;
		while (it >= window) {
			it -= window;
		}
		oup[k] = sig[k] - seas[it];
	}
	
	free(w);
	free(seas);
	free(mt);
}